

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O0

QCborMap __thiscall QCborValue::toMap(QCborValue *this)

{
  QCborMap *in_RSI;
  QExplicitlySharedDataPointer<QCborContainerPrivate> in_RDI;
  long in_FS_OFFSET;
  QCborValue *this_00;
  QCborContainerPrivate *local_8;
  
  local_8 = *(QCborContainerPrivate **)(in_FS_OFFSET + 0x28);
  this_00 = (QCborValue *)&stack0xfffffffffffffff0;
  QCborMap::QCborMap((QCborMap *)0x470bc6);
  toMap(this_00,in_RSI);
  QCborMap::~QCborMap((QCborMap *)0x470be6);
  if (*(QCborContainerPrivate **)(in_FS_OFFSET + 0x28) == local_8) {
    return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
           (QExplicitlySharedDataPointer<QCborContainerPrivate>)in_RDI.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

QCborMap QCborValue::toMap() const
{
    return toMap(QCborMap());
}